

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

void __thiscall wasm::Wasm2JSBuilder::addMemoryGrowFunc(Wasm2JSBuilder *this,Ref ast,Module *wasm)

{
  IString view;
  IString name;
  IString view_00;
  IString name_00;
  IString view_01;
  IString name_01;
  IString view_02;
  IString name_02;
  IString view_03;
  IString name_03;
  IString view_04;
  IString name_04;
  IString view_05;
  IString name_05;
  IString view_06;
  IString name_06;
  size_t sVar1;
  bool bVar2;
  Ref *pRVar3;
  Value *pVVar4;
  Ref RVar5;
  char *pcVar6;
  Ref RVar7;
  reference this_00;
  pointer this_01;
  ValueBuilder *pVVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  Ref in_R8;
  IString name_07;
  IString name_08;
  IString name_09;
  IString target;
  IString name_10;
  IString name_11;
  IString name_12;
  IString name_13;
  IString name_14;
  IString name_15;
  IString target_00;
  IString target_01;
  IString name_16;
  IString name_17;
  IString name_18;
  IString name_19;
  IString name_20;
  IString name_21;
  IString name_22;
  IString name_23;
  IString name_24;
  IString name_25;
  IString name_26;
  IString name_27;
  IString arg;
  IString op;
  IString name_28;
  IString op_00;
  IString name_29;
  IString op_01;
  IString op_02;
  IString op_03;
  IString name_30;
  IString name_31;
  IString key;
  IString op_04;
  IString op_05;
  IString op_06;
  IString local_5a8;
  Value *local_598;
  Value *local_590;
  ValueBuilder *local_588;
  char *local_580;
  Value *local_578;
  Ref local_570;
  size_t local_568;
  IString local_560;
  Value *local_550;
  Value *local_548;
  Ref local_540;
  ValueBuilder *local_538;
  size_t local_530;
  Value *local_528;
  Ref local_520;
  size_t local_518;
  ValueBuilder *local_510;
  size_t local_508;
  Value *local_500;
  IString local_4f8;
  Ref local_4e8;
  Value *local_4e0;
  Value *local_4d8;
  Ref local_4d0;
  IString local_4c8;
  Value *local_4b8;
  Ref local_4b0;
  size_t local_4a8;
  ValueBuilder *local_4a0;
  size_t local_498;
  Value *local_490;
  Value *local_488;
  Ref local_480;
  size_t local_478;
  Value *local_470;
  char *local_468;
  char *local_460;
  size_t local_458;
  char *local_450;
  size_t local_448;
  char *local_440;
  size_t local_438;
  char *local_430;
  size_t local_428;
  char *local_420;
  size_t local_418;
  char *local_410;
  size_t local_408;
  char *local_400;
  size_t local_3f8;
  char *local_3f0;
  ValueBuilder *local_3e8;
  char *local_3e0;
  size_t local_3d8;
  char *local_3d0;
  size_t local_3c8;
  char *local_3c0;
  size_t local_3b8;
  char *local_3b0;
  size_t local_3a8;
  char *local_3a0;
  ValueBuilder *local_398;
  char *local_390;
  ValueBuilder *local_388;
  char *local_380;
  anon_class_8_1_a7b1b3ad local_378;
  anon_class_8_1_a7b1b3ad setHeap;
  IString local_358;
  IString local_348;
  Value *local_338;
  Ref local_330;
  Value *local_328;
  Ref local_320;
  IString local_318;
  Value *local_308;
  ValueBuilder *local_300;
  char *local_2f8;
  Ref local_2f0;
  Value *local_2e8;
  Value *local_2e0;
  IString local_2d8;
  Value *local_2c8;
  Value *local_2c0;
  Value *local_2b8;
  Value *local_2b0;
  Ref newHEAP8;
  IString local_2a0;
  Value *local_290;
  ValueBuilder *local_288;
  size_t local_280;
  Value *local_278;
  ValueBuilder *local_270;
  size_t local_268;
  Value *local_260;
  Value *local_258;
  IString local_250;
  Value *local_240;
  Value *local_238;
  Value *local_230;
  Value *local_228;
  Ref newBuffer;
  IString local_1f8;
  Value *local_1e8;
  Value *local_1e0;
  IString local_1d8;
  IString local_1c8;
  Value *local_1b8;
  Ref local_1b0;
  size_t local_1a8;
  IString local_1a0;
  Value *local_190;
  Value *local_188;
  Ref local_180;
  Value *local_178;
  Ref local_170;
  Ref block;
  char *local_160;
  IString local_140;
  Value *local_130;
  Value *local_128;
  char *local_120;
  IString local_118;
  Value *local_108;
  Value *local_100;
  Ref local_f8;
  Ref newPages;
  IString local_d0;
  Value *local_c0;
  Value *local_b8;
  Ref local_b0;
  Ref oldPages;
  char *local_a0;
  IString local_78;
  Value *local_68;
  Value *local_60;
  Value *local_58;
  IString local_50;
  Value *local_40;
  ValueBuilder *local_38;
  size_t local_30;
  Ref local_28;
  Ref memoryGrowFunc;
  Module *wasm_local;
  Wasm2JSBuilder *this_local;
  Ref ast_local;
  char *extraout_RDX_11;
  
  local_38 = WASM_MEMORY_GROW;
  local_30 = _getGCData;
  name_07.str._M_str = (char *)wasm;
  name_07.str._M_len = _getGCData;
  pVVar8 = WASM_MEMORY_GROW;
  memoryGrowFunc.inst = (Value *)wasm;
  this_local = (Wasm2JSBuilder *)ast.inst;
  local_40 = (Value *)cashew::ValueBuilder::makeFunction(WASM_MEMORY_GROW,name_07);
  local_28 = (Ref)local_40;
  IString::IString(&local_50,"pagesToAdd");
  arg.str._M_str = (char *)pVVar8;
  arg.str._M_len = (size_t)local_50.str._M_str;
  cashew::ValueBuilder::appendArgumentToFunction
            ((ValueBuilder *)local_40,(Ref)local_50.str._M_len,arg);
  pRVar3 = (Ref *)cashew::Ref::operator[]((uint)&local_28);
  pVVar4 = cashew::Ref::operator->(pRVar3);
  IString::IString(&local_78,"pagesToAdd");
  name_08.str._M_str = extraout_RDX;
  name_08.str._M_len = (size_t)local_78.str._M_str;
  local_68 = (Value *)cashew::ValueBuilder::makeName((ValueBuilder *)local_78.str._M_len,name_08);
  sVar1 = BLOCK;
  RVar7.inst = cashew::SET.inst;
  IString::IString((IString *)&oldPages,"pagesToAdd");
  name_09.str._M_str = extraout_RDX_00;
  name_09.str._M_len = (size_t)local_a0;
  RVar5 = cashew::ValueBuilder::makeName(oldPages.inst,name_09);
  pcVar6 = (char *)makeJsCoercion(RVar5,JS_INT);
  op.str._M_str = pcVar6;
  op.str._M_len = sVar1;
  local_60 = (Value *)cashew::ValueBuilder::makeBinary((ValueBuilder *)local_68,RVar7,op,in_R8);
  local_58 = (Value *)cashew::ValueBuilder::makeStatement((Ref)local_60);
  cashew::Value::push_back(pVVar4,(Ref)local_58);
  local_b0 = cashew::ValueBuilder::makeVar(false);
  pRVar3 = (Ref *)cashew::Ref::operator[]((uint)&local_28);
  pVVar4 = cashew::Ref::operator->(pRVar3);
  local_b8 = local_b0.inst;
  cashew::Value::push_back(pVVar4,local_b0);
  local_c0 = local_b0.inst;
  IString::IString(&local_d0,"oldPages");
  newPages.inst = WASM_MEMORY_SIZE;
  target.str._M_str = extraout_RDX_01;
  target.str._M_len = _getKind;
  RVar7 = cashew::ValueBuilder::makeCall(WASM_MEMORY_SIZE,target);
  pcVar6 = (char *)makeJsCoercion(RVar7,JS_INT);
  name_28.str._M_str = pcVar6;
  name_28.str._M_len = (size_t)local_d0.str._M_str;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)local_c0,(Ref)local_d0.str._M_len,name_28,in_R8)
  ;
  local_f8 = cashew::ValueBuilder::makeVar(false);
  pRVar3 = (Ref *)cashew::Ref::operator[]((uint)&local_28);
  pVVar4 = cashew::Ref::operator->(pRVar3);
  local_100 = local_f8.inst;
  cashew::Value::push_back(pVVar4,local_f8);
  local_108 = local_f8.inst;
  IString::IString(&local_118,"newPages");
  IString::IString(&local_140,"oldPages");
  name_10.str._M_str = extraout_RDX_02;
  name_10.str._M_len = (size_t)local_140.str._M_str;
  local_130 = (Value *)cashew::ValueBuilder::makeName((ValueBuilder *)local_140.str._M_len,name_10);
  sVar1 = _setEnabled;
  RVar7.inst = cashew::PLUS.inst;
  IString::IString((IString *)&block,"pagesToAdd");
  name_11.str._M_str = extraout_RDX_03;
  name_11.str._M_len = (size_t)local_160;
  RVar5 = cashew::ValueBuilder::makeName(block.inst,name_11);
  op_00.str._M_str = (char *)RVar5.inst;
  op_00.str._M_len = sVar1;
  local_128 = (Value *)cashew::ValueBuilder::makeBinary((ValueBuilder *)local_130,RVar7,op_00,in_R8)
  ;
  local_120 = (char *)makeJsCoercion((Ref)local_128,JS_INT);
  name_29.str._M_str = local_120;
  name_29.str._M_len = (size_t)local_118.str._M_str;
  cashew::ValueBuilder::appendToVar
            ((ValueBuilder *)local_108,(Ref)local_118.str._M_len,name_29,in_R8);
  local_170 = cashew::ValueBuilder::makeBlock();
  pRVar3 = (Ref *)cashew::Ref::operator[]((uint)&local_28);
  pVVar4 = cashew::Ref::operator->(pRVar3);
  IString::IString(&local_1a0,"oldPages");
  name_12.str._M_str = extraout_RDX_04;
  name_12.str._M_len = (size_t)local_1a0.str._M_str;
  local_190 = (Value *)cashew::ValueBuilder::makeName((ValueBuilder *)local_1a0.str._M_len,name_12);
  local_1b0.inst = cashew::LT.inst;
  local_1a8 = _getPrecedence;
  IString::IString(&local_1c8,"newPages");
  name_13.str._M_str = extraout_RDX_05;
  name_13.str._M_len = (size_t)local_1c8.str._M_str;
  local_1b8 = (Value *)cashew::ValueBuilder::makeName((ValueBuilder *)local_1c8.str._M_len,name_13);
  op_01.str._M_str = (char *)local_1b8;
  op_01.str._M_len = local_1a8;
  local_188 = (Value *)cashew::ValueBuilder::makeBinary
                                 ((ValueBuilder *)local_190,local_1b0,op_01,in_R8);
  IString::IString(&local_1d8,"&&");
  IString::IString(&local_1f8,"newPages");
  name_14.str._M_str = extraout_RDX_06;
  name_14.str._M_len = (size_t)local_1f8.str._M_str;
  local_1e8 = (Value *)cashew::ValueBuilder::makeName((ValueBuilder *)local_1f8.str._M_len,name_14);
  sVar1 = _getPrecedence;
  RVar7.inst = cashew::LT.inst;
  RVar5 = cashew::ValueBuilder::makeInt(0x10000);
  op_02.str._M_str = (char *)RVar5.inst;
  op_02.str._M_len = sVar1;
  local_1e0 = (Value *)cashew::ValueBuilder::makeBinary((ValueBuilder *)local_1e8,RVar7,op_02,in_R8)
  ;
  op_03.str._M_str = (char *)local_1e0;
  op_03.str._M_len = (size_t)local_1d8.str._M_str;
  local_180 = cashew::ValueBuilder::makeBinary(local_188,(Ref)local_1d8.str._M_len,op_03,in_R8);
  RVar7.inst = local_170.inst;
  cashew::Ref::Ref(&newBuffer,(Value *)0x0);
  local_178 = (Value *)cashew::ValueBuilder::makeIf(local_180,RVar7,newBuffer);
  cashew::Value::push_back(pVVar4,(Ref)local_178);
  local_238 = (Value *)cashew::ValueBuilder::makeVar(false);
  local_230 = local_170.inst;
  local_228 = local_238;
  cashew::ValueBuilder::appendToBlock(local_170,(Ref)local_238);
  local_240 = local_228;
  IString::IString(&local_250,"newBuffer");
  local_270 = ARRAY_BUFFER;
  local_268 = _memmove;
  local_288 = MATH_IMUL;
  local_280 = cashew::CONDITIONAL;
  IString::IString(&local_2a0,"newPages");
  name_15.str._M_str = extraout_RDX_07;
  name_15.str._M_len = (size_t)local_2a0.str._M_str;
  local_290 = (Value *)cashew::ValueBuilder::makeName((ValueBuilder *)local_2a0.str._M_len,name_15);
  RVar7 = cashew::ValueBuilder::makeInt(0x10000);
  target_00.str._M_str = (char *)local_290;
  target_00.str._M_len = local_280;
  newHEAP8.inst = RVar7.inst;
  local_278 = (Value *)cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                                 (local_288,target_00,RVar7,in_R8);
  target_01.str._M_str = (char *)local_278;
  target_01.str._M_len = local_268;
  local_260 = (Value *)cashew::ValueBuilder::makeCall<cashew::Ref>(local_270,target_01,RVar7);
  local_258 = (Value *)cashew::ValueBuilder::makeNew((Ref)local_260);
  name_30.str._M_str = (char *)local_258;
  name_30.str._M_len = (size_t)local_250.str._M_str;
  cashew::ValueBuilder::appendToVar
            ((ValueBuilder *)local_240,(Ref)local_250.str._M_len,name_30,in_R8);
  local_2c0 = (Value *)cashew::ValueBuilder::makeVar(false);
  local_2b8 = local_170.inst;
  local_2b0 = local_2c0;
  cashew::ValueBuilder::appendToBlock(local_170,(Ref)local_2c0);
  local_2c8 = local_2b0;
  IString::IString(&local_2d8,"newHEAP8");
  local_300 = INT8ARRAY;
  local_2f8 = ASM_FUNC;
  name_16.str._M_str = extraout_RDX_08;
  name_16.str._M_len = (size_t)ASM_FUNC;
  local_2f0 = cashew::ValueBuilder::makeName(INT8ARRAY,name_16);
  IString::IString(&local_318,"newBuffer");
  name_17.str._M_str = extraout_RDX_09;
  name_17.str._M_len = (size_t)local_318.str._M_str;
  local_308 = (Value *)cashew::ValueBuilder::makeName((ValueBuilder *)local_318.str._M_len,name_17);
  local_2e8 = (Value *)cashew::ValueBuilder::makeCall(local_2f0,(Ref)local_308);
  RVar7 = cashew::ValueBuilder::makeNew((Ref)local_2e8);
  name_31.str._M_str = (char *)RVar7.inst;
  name_31.str._M_len = (size_t)local_2d8.str._M_str;
  local_2e0 = RVar7.inst;
  cashew::ValueBuilder::appendToVar
            ((ValueBuilder *)local_2c8,(Ref)local_2d8.str._M_len,name_31,in_R8);
  local_320.inst = local_170.inst;
  IString::IString(&local_348,"newHEAP8");
  name_18.str._M_str = extraout_RDX_10;
  name_18.str._M_len = (size_t)local_348.str._M_str;
  local_338 = (Value *)cashew::ValueBuilder::makeName((ValueBuilder *)local_348.str._M_len,name_18);
  IString::IString(&local_358,"set");
  key.str._M_str = (char *)RVar7.inst;
  key.str._M_len = (size_t)local_358.str._M_str;
  local_330 = cashew::ValueBuilder::makeDot(local_338,(Ref)local_358.str._M_len,key);
  setHeap.block = (Ref *)cashew::HEAP8;
  name_19.str._M_str = extraout_RDX_11;
  name_19.str._M_len = (size_t)cashew::HEAPF64;
  RVar7 = cashew::ValueBuilder::makeName(cashew::HEAP8,name_19);
  local_328 = (Value *)cashew::ValueBuilder::makeCall(local_330,RVar7);
  cashew::ValueBuilder::appendToBlock(local_320,(Ref)local_328);
  local_378.block = &local_170;
  local_388 = cashew::HEAP8;
  local_380 = cashew::HEAPF64;
  local_398 = INT8ARRAY;
  local_390 = ASM_FUNC;
  name_06.str._M_str = cashew::HEAPF64;
  name_06.str._M_len = (size_t)cashew::HEAP8;
  view_06.str._M_str = ASM_FUNC;
  view_06.str._M_len = (size_t)INT8ARRAY;
  addMemoryGrowFunc::anon_class_8_1_a7b1b3ad::operator()(&local_378,name_06,view_06);
  local_3a8 = cashew::HEAP16;
  local_3a0 = _getFunctionOrNull;
  local_3b8 = INT16ARRAY;
  local_3b0 = _getLocalType;
  name_05.str._M_str = _getFunctionOrNull;
  name_05.str._M_len = cashew::HEAP16;
  view_05.str._M_str = _getLocalType;
  view_05.str._M_len = INT16ARRAY;
  addMemoryGrowFunc::anon_class_8_1_a7b1b3ad::operator()(&local_378,name_05,view_05);
  local_3c8 = cashew::HEAP32;
  local_3c0 = _str;
  local_3d8 = INT32ARRAY;
  local_3d0 = _operator__;
  name_04.str._M_str = _str;
  name_04.str._M_len = cashew::HEAP32;
  view_04.str._M_str = _operator__;
  view_04.str._M_len = INT32ARRAY;
  addMemoryGrowFunc::anon_class_8_1_a7b1b3ad::operator()(&local_378,name_04,view_04);
  local_3e8 = cashew::HEAPU8;
  local_3e0 = _containsPass;
  local_3f8 = UINT8ARRAY;
  local_3f0 = _getByteSize;
  name_03.str._M_str = _containsPass;
  name_03.str._M_len = (size_t)cashew::HEAPU8;
  view_03.str._M_str = _getByteSize;
  view_03.str._M_len = UINT8ARRAY;
  addMemoryGrowFunc::anon_class_8_1_a7b1b3ad::operator()(&local_378,name_03,view_03);
  local_408 = cashew::HEAPU16;
  local_400 = _pthread_self;
  local_418 = UINT16ARRAY;
  local_410 = cashew::DIV;
  name_02.str._M_str = _pthread_self;
  name_02.str._M_len = cashew::HEAPU16;
  view_02.str._M_str = cashew::DIV;
  view_02.str._M_len = UINT16ARRAY;
  addMemoryGrowFunc::anon_class_8_1_a7b1b3ad::operator()(&local_378,name_02,view_02);
  local_428 = cashew::HEAPU32;
  local_420 = __Rb_tree_insert_and_rebalance;
  local_438 = UINT32ARRAY;
  local_430 = cashew::LSHIFT;
  name_01.str._M_str = __Rb_tree_insert_and_rebalance;
  name_01.str._M_len = cashew::HEAPU32;
  view_01.str._M_str = cashew::LSHIFT;
  view_01.str._M_len = UINT32ARRAY;
  addMemoryGrowFunc::anon_class_8_1_a7b1b3ad::operator()(&local_378,name_01,view_01);
  local_448 = cashew::HEAPF32;
  local_440 = _toString_abi_cxx11_;
  local_458 = FLOAT32ARRAY;
  local_450 = EXPRESSION_RESULT;
  name_00.str._M_str = _toString_abi_cxx11_;
  name_00.str._M_len = cashew::HEAPF32;
  view_00.str._M_str = EXPRESSION_RESULT;
  view_00.str._M_len = FLOAT32ARRAY;
  addMemoryGrowFunc::anon_class_8_1_a7b1b3ad::operator()(&local_378,name_00,view_00);
  local_468 = cashew::HEAPF64;
  local_460 = __ostringstream;
  local_478 = FLOAT64ARRAY;
  local_470 = _getShared;
  name.str._M_str = __ostringstream;
  name.str._M_len = (size_t)cashew::HEAPF64;
  view.str._M_str = (char *)_getShared;
  view.str._M_len = FLOAT64ARRAY;
  RVar7.inst = _getShared;
  addMemoryGrowFunc::anon_class_8_1_a7b1b3ad::operator()(&local_378,name,view);
  local_480.inst = local_170.inst;
  local_4a0 = BUFFER;
  local_498 = _operator_;
  name_20.str._M_str = extraout_RDX_12;
  name_20.str._M_len = _operator_;
  local_490 = (Value *)cashew::ValueBuilder::makeName(BUFFER,name_20);
  local_4b0.inst = cashew::SET.inst;
  local_4a8 = BLOCK;
  IString::IString(&local_4c8,"newBuffer");
  name_21.str._M_str = extraout_RDX_13;
  name_21.str._M_len = (size_t)local_4c8.str._M_str;
  local_4b8 = (Value *)cashew::ValueBuilder::makeName((ValueBuilder *)local_4c8.str._M_len,name_21);
  op_04.str._M_str = (char *)local_4b8;
  op_04.str._M_len = local_4a8;
  local_488 = (Value *)cashew::ValueBuilder::makeBinary
                                 ((ValueBuilder *)local_490,local_4b0,op_04,RVar7);
  cashew::ValueBuilder::appendToBlock(local_480,(Ref)local_488);
  bVar2 = std::
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ::empty((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                   *)(memoryGrowFunc.inst + 5));
  if (!bVar2) {
    this_00 = std::
              vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                            *)(memoryGrowFunc.inst + 5),0);
    this_01 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(this_00)
    ;
    bVar2 = Importable::imported(&this_01->super_Importable);
    if (bVar2) {
      local_4d0.inst = local_170.inst;
      IString::IString(&local_4f8,"memory");
      name_22.str._M_str = extraout_RDX_14;
      name_22.str._M_len = (size_t)local_4f8.str._M_str;
      local_4e8 = cashew::ValueBuilder::makeName((ValueBuilder *)local_4f8.str._M_len,name_22);
      local_510 = BUFFER;
      local_508 = _operator_;
      name_23.str._M_str = extraout_RDX_15;
      name_23.str._M_len = _operator_;
      local_500 = (Value *)cashew::ValueBuilder::makeName(BUFFER,name_23);
      local_4e0 = (Value *)cashew::ValueBuilder::makeDot(local_4e8,(Ref)local_500);
      local_520.inst = cashew::SET.inst;
      local_518 = BLOCK;
      local_538 = BUFFER;
      local_530 = _operator_;
      name_24.str._M_str = extraout_RDX_16;
      name_24.str._M_len = _operator_;
      local_528 = (Value *)cashew::ValueBuilder::makeName(BUFFER,name_24);
      op_05.str._M_str = (char *)local_528;
      op_05.str._M_len = local_518;
      local_4d8 = (Value *)cashew::ValueBuilder::makeBinary
                                     ((ValueBuilder *)local_4e0,local_520,op_05,RVar7);
      cashew::ValueBuilder::appendToBlock(local_4d0,(Ref)local_4d8);
    }
  }
  bVar2 = needsBufferView((Module *)memoryGrowFunc.inst);
  if (bVar2) {
    local_540.inst = local_170.inst;
    IString::IString(&local_560,"bufferView");
    name_25.str._M_str = extraout_RDX_17;
    name_25.str._M_len = (size_t)local_560.str._M_str;
    local_550 = (Value *)cashew::ValueBuilder::makeName
                                   ((ValueBuilder *)local_560.str._M_len,name_25);
    local_570.inst = cashew::SET.inst;
    local_568 = BLOCK;
    local_588 = cashew::HEAPU8;
    local_580 = _containsPass;
    name_26.str._M_str = extraout_RDX_18;
    name_26.str._M_len = (size_t)_containsPass;
    local_578 = (Value *)cashew::ValueBuilder::makeName(cashew::HEAPU8,name_26);
    op_06.str._M_str = (char *)local_578;
    op_06.str._M_len = local_568;
    local_548 = (Value *)cashew::ValueBuilder::makeBinary
                                   ((ValueBuilder *)local_550,local_570,op_06,RVar7);
    cashew::ValueBuilder::appendToBlock(local_540,(Ref)local_548);
  }
  pRVar3 = (Ref *)cashew::Ref::operator[]((uint)&local_28);
  pVVar4 = cashew::Ref::operator->(pRVar3);
  IString::IString(&local_5a8,"oldPages");
  name_27.str._M_str = extraout_RDX_19;
  name_27.str._M_len = (size_t)local_5a8.str._M_str;
  local_598 = (Value *)cashew::ValueBuilder::makeName((ValueBuilder *)local_5a8.str._M_len,name_27);
  local_590 = (Value *)cashew::ValueBuilder::makeReturn((Ref)local_598);
  cashew::Value::push_back(pVVar4,(Ref)local_590);
  pVVar4 = cashew::Ref::operator->((Ref *)&this_local);
  cashew::Value::push_back(pVVar4,local_28);
  return;
}

Assistant:

void Wasm2JSBuilder::addMemoryGrowFunc(Ref ast, Module* wasm) {
  Ref memoryGrowFunc = ValueBuilder::makeFunction(WASM_MEMORY_GROW);
  ValueBuilder::appendArgumentToFunction(memoryGrowFunc, IString("pagesToAdd"));

  memoryGrowFunc[3]->push_back(
    ValueBuilder::makeStatement(ValueBuilder::makeBinary(
      ValueBuilder::makeName(IString("pagesToAdd")),
      SET,
      makeJsCoercion(ValueBuilder::makeName(IString("pagesToAdd")),
                     JsType::JS_INT))));

  Ref oldPages = ValueBuilder::makeVar();
  memoryGrowFunc[3]->push_back(oldPages);
  ValueBuilder::appendToVar(
    oldPages,
    IString("oldPages"),
    makeJsCoercion(ValueBuilder::makeCall(WASM_MEMORY_SIZE), JsType::JS_INT));

  Ref newPages = ValueBuilder::makeVar();
  memoryGrowFunc[3]->push_back(newPages);
  ValueBuilder::appendToVar(
    newPages,
    IString("newPages"),
    makeJsCoercion(
      ValueBuilder::makeBinary(ValueBuilder::makeName(IString("oldPages")),
                               PLUS,
                               ValueBuilder::makeName(IString("pagesToAdd"))),
      JsType::JS_INT));

  Ref block = ValueBuilder::makeBlock();
  memoryGrowFunc[3]->push_back(ValueBuilder::makeIf(
    ValueBuilder::makeBinary(
      ValueBuilder::makeBinary(ValueBuilder::makeName(IString("oldPages")),
                               LT,
                               ValueBuilder::makeName(IString("newPages"))),
      IString("&&"),
      ValueBuilder::makeBinary(ValueBuilder::makeName(IString("newPages")),
                               LT,
                               ValueBuilder::makeInt(Memory::kMaxSize32))),
    block,
    NULL));

  Ref newBuffer = ValueBuilder::makeVar();
  ValueBuilder::appendToBlock(block, newBuffer);
  ValueBuilder::appendToVar(
    newBuffer,
    IString("newBuffer"),
    ValueBuilder::makeNew(ValueBuilder::makeCall(
      ARRAY_BUFFER,
      ValueBuilder::makeCall(MATH_IMUL,
                             ValueBuilder::makeName(IString("newPages")),
                             ValueBuilder::makeInt(Memory::kPageSize)))));

  Ref newHEAP8 = ValueBuilder::makeVar();
  ValueBuilder::appendToBlock(block, newHEAP8);
  ValueBuilder::appendToVar(newHEAP8,
                            IString("newHEAP8"),
                            ValueBuilder::makeNew(ValueBuilder::makeCall(
                              ValueBuilder::makeName(INT8ARRAY),
                              ValueBuilder::makeName(IString("newBuffer")))));

  ValueBuilder::appendToBlock(
    block,
    ValueBuilder::makeCall(
      ValueBuilder::makeDot(ValueBuilder::makeName(IString("newHEAP8")),
                            IString("set")),
      ValueBuilder::makeName(HEAP8)));

  auto setHeap = [&](IString name, IString view) {
    ValueBuilder::appendToBlock(
      block,
      ValueBuilder::makeBinary(
        ValueBuilder::makeName(name),
        SET,
        ValueBuilder::makeNew(ValueBuilder::makeCall(
          ValueBuilder::makeName(view),
          ValueBuilder::makeName(IString("newBuffer"))))));
  };

  setHeap(HEAP8, INT8ARRAY);
  setHeap(HEAP16, INT16ARRAY);
  setHeap(HEAP32, INT32ARRAY);
  setHeap(HEAPU8, UINT8ARRAY);
  setHeap(HEAPU16, UINT16ARRAY);
  setHeap(HEAPU32, UINT32ARRAY);
  setHeap(HEAPF32, FLOAT32ARRAY);
  setHeap(HEAPF64, FLOAT64ARRAY);

  ValueBuilder::appendToBlock(
    block,
    ValueBuilder::makeBinary(ValueBuilder::makeName(BUFFER),
                             SET,
                             ValueBuilder::makeName(IString("newBuffer"))));

  // apply the changes to the memory import
  if (!wasm->memories.empty() && wasm->memories[0]->imported()) {
    ValueBuilder::appendToBlock(
      block,
      ValueBuilder::makeBinary(
        ValueBuilder::makeDot(ValueBuilder::makeName("memory"),
                              ValueBuilder::makeName(BUFFER)),
        SET,
        ValueBuilder::makeName(BUFFER)));
  }

  if (needsBufferView(*wasm)) {
    ValueBuilder::appendToBlock(
      block,
      ValueBuilder::makeBinary(ValueBuilder::makeName("bufferView"),
                               SET,
                               ValueBuilder::makeName(HEAPU8)));
  }

  memoryGrowFunc[3]->push_back(
    ValueBuilder::makeReturn(ValueBuilder::makeName(IString("oldPages"))));

  ast->push_back(memoryGrowFunc);
}